

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_PCM.cpp
# Opt level: O1

h__Writer * __thiscall
ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(h__Writer *this,AudioDescriptor *ADesc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Rational RVar5;
  Rational RVar6;
  i32_t iVar7;
  i32_t iVar8;
  i32_t iVar9;
  i32_t iVar10;
  i32_t iVar11;
  i32_t iVar12;
  i32_t iVar13;
  ui32_t ct_size;
  ui32_t BytesPerEditUnit;
  MDDEntry *pMVar14;
  ILogSink *this_00;
  Rational *in_RDX;
  undefined1 *puVar15;
  char *fmt;
  undefined **local_108;
  Rational local_100;
  undefined1 local_f8 [17];
  undefined8 uStack_e7;
  undefined1 local_d8 [17];
  Rational RStack_c7;
  string local_b8;
  
  if (ADesc[0x12].Locked == 1) {
    iVar1 = in_RDX->Numerator;
    iVar2 = in_RDX->Denominator;
    if (((((((ASDCP::EditRate_24 == iVar1) && (DAT_00252e54 == iVar2)) ||
           ((ASDCP::EditRate_25 == iVar1 && (DAT_00252e7c == iVar2)))) ||
          (((ASDCP::EditRate_30 == iVar1 && (DAT_00252e84 == iVar2)) ||
           ((ASDCP::EditRate_48 == iVar1 && (DAT_00252e64 == iVar2)))))) ||
         (((((ASDCP::EditRate_50 == iVar1 && (DAT_00252e8c == iVar2)) ||
            ((ASDCP::EditRate_60 == iVar1 && (DAT_00252e94 == iVar2)))) ||
           (((ASDCP::EditRate_96 == iVar1 && (DAT_00252e9c == iVar2)) ||
            ((ASDCP::EditRate_100 == iVar1 && (DAT_00252ea4 == iVar2)))))) ||
          (((((ASDCP::EditRate_120 == iVar1 && (DAT_00252eac == iVar2)) ||
             ((ASDCP::EditRate_192 == iVar1 && (DAT_00252eb4 == iVar2)))) ||
            ((ASDCP::EditRate_200 == iVar1 && (DAT_00252ebc == iVar2)))) ||
           (((ASDCP::EditRate_240 == iVar1 && (DAT_00252ec4 == iVar2)) ||
            ((((ASDCP::EditRate_16 == iVar1 && (DAT_00252ecc == iVar2)) ||
              ((ASDCP::EditRate_18 == iVar1 && (DAT_00252ed4 == iVar2)))) ||
             ((ASDCP::EditRate_20 == iVar1 && (DAT_00252edc == iVar2)))))))))))) ||
        ((ASDCP::EditRate_22 == iVar1 && (DAT_00252ee4 == iVar2)))) ||
       ((ASDCP::EditRate_23_98 == iVar1 && (DAT_00252e5c == iVar2)))) {
      if (((ASDCP::SampleRate_48k == in_RDX[1].Numerator) && (DAT_00252e6c == in_RDX[1].Denominator)
          ) || ((ASDCP::SampleRate_96k == in_RDX[1].Numerator &&
                (DAT_00252e74 == in_RDX[1].Denominator)))) {
        if (ADesc->AudioSamplingRate == (Rational)0x0) {
          __assert_fail("m_Dict",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_PCM.cpp"
                        ,0x25a,
                        "ASDCP::Result_t ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(const AudioDescriptor &)"
                       );
        }
        RVar5 = *in_RDX;
        RVar6 = in_RDX[1];
        iVar10 = in_RDX[2].Numerator;
        iVar11 = in_RDX[2].Denominator;
        iVar12 = in_RDX[3].Numerator;
        iVar13 = in_RDX[3].Denominator;
        iVar7 = in_RDX[4].Denominator;
        iVar8 = in_RDX[5].Numerator;
        iVar9 = in_RDX[5].Denominator;
        ADesc[0x25].AvgBps = in_RDX[4].Numerator;
        ADesc[0x25].LinkedTrackID = iVar7;
        ADesc[0x25].ContainerDuration = iVar8;
        ADesc[0x25].ChannelFormat = iVar9;
        ADesc[0x25].Locked = iVar10;
        ADesc[0x25].ChannelCount = iVar11;
        ADesc[0x25].QuantizationBits = iVar12;
        ADesc[0x25].BlockAlign = iVar13;
        ADesc[0x25].EditRate = RVar5;
        ADesc[0x25].AudioSamplingRate = RVar6;
        PCM_ADesc_to_MD((ASDCP *)this,ADesc + 0x25,
                        *(WaveAudioDescriptor **)&ADesc[0x10].QuantizationBits);
        if (-1 < *(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>
                          ._vptr_TrackFileWriter) {
          pMVar14 = Dictionary::Type((Dictionary *)ADesc->AudioSamplingRate,MDD_WAVEssence);
          RVar5 = *(Rational *)(pMVar14->ul + 8);
          ADesc[0x26].EditRate = *(Rational *)pMVar14->ul;
          ADesc[0x26].AudioSamplingRate = RVar5;
          *(undefined1 *)((long)&ADesc[0x26].AudioSamplingRate.Denominator + 3) = 1;
          if (ADesc[0x12].Locked == 1) {
            ADesc[0x12].Locked = 2;
            puVar15 = Kumu::RESULT_OK;
          }
          else {
            puVar15 = Kumu::RESULT_STATE;
          }
          Kumu::Result_t::Result_t((Result_t *)&stack0xffffffffffffff68,(Result_t *)puVar15);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
          Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        }
        if (*(int *)&(this->super_h__ASDCPWriter).super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.
                     _vptr_TrackFileWriter < 0) {
          return this;
        }
        pMVar14 = Dictionary::Type((Dictionary *)ADesc->AudioSamplingRate,MDD_WAVWrappingFrame);
        local_b8._M_string_length._0_1_ = 1;
        local_b8._9_8_ = *(undefined8 *)pMVar14->ul;
        local_b8.field_2._1_8_ = *(undefined8 *)(pMVar14->ul + 8);
        local_b8._M_dataplus._M_p = (pointer)&PTR__IArchive_0021f038;
        local_d8[8] = true;
        local_d8._9_8_ = ADesc[0x26].EditRate;
        RStack_c7 = ADesc[0x26].AudioSamplingRate;
        local_d8._0_8_ = &PTR__IArchive_0021f038;
        pMVar14 = Dictionary::Type((Dictionary *)ADesc->AudioSamplingRate,MDD_SoundDataDef);
        local_f8[8] = 1;
        local_f8._9_8_ = *(undefined8 *)pMVar14->ul;
        uStack_e7 = *(undefined8 *)(pMVar14->ul + 8);
        local_f8._0_8_ = &PTR__IArchive_0021f038;
        local_108 = &PTR__IArchive_002244f8;
        local_100 = ADesc[0x25].EditRate;
        BytesPerEditUnit = derive_timecode_rate_from_edit_rate(&ADesc[0x25].EditRate);
        ceil(((double)ADesc[0x25].AudioSamplingRate.Numerator /
             (double)ADesc[0x25].AudioSamplingRate.Denominator) /
             ((double)ADesc[0x25].EditRate.Numerator / (double)ADesc[0x25].EditRate.Denominator));
        h__ASDCPWriter::WriteASDCPHeader
                  ((h__ASDCPWriter *)&stack0xffffffffffffff68,(string *)ADesc,
                   (UL *)&PCM_PACKAGE_LABEL_abi_cxx11_,&local_b8,(UL *)&SOUND_DEF_LABEL_abi_cxx11_,
                   (UL *)local_d8,(Rational *)local_f8,(ui32_t)&local_108,BytesPerEditUnit);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        return this;
      }
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      uVar3 = in_RDX[1].Numerator;
      uVar4 = in_RDX[1].Denominator;
      fmt = "AudioDescriptor.AudioSamplingRate is not 48000/1 or 96000/1: %d/%d\n";
    }
    else {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      uVar3 = in_RDX->Numerator;
      uVar4 = in_RDX->Denominator;
      fmt = "AudioDescriptor.EditRate is not a supported value: %d/%d\n";
    }
    Kumu::ILogSink::Error(this_00,fmt,(ulong)uVar3,(ulong)uVar4);
    puVar15 = ASDCP::RESULT_RAW_FORMAT;
  }
  else {
    puVar15 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar15);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::PCM::MXFWriter::h__Writer::SetSourceStream(const AudioDescriptor& ADesc)
{
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( ADesc.EditRate != EditRate_24
       && ADesc.EditRate != EditRate_25
       && ADesc.EditRate != EditRate_30
       && ADesc.EditRate != EditRate_48
       && ADesc.EditRate != EditRate_50
       && ADesc.EditRate != EditRate_60
       && ADesc.EditRate != EditRate_96
       && ADesc.EditRate != EditRate_100
       && ADesc.EditRate != EditRate_120
       && ADesc.EditRate != EditRate_192
       && ADesc.EditRate != EditRate_200
       && ADesc.EditRate != EditRate_240
       && ADesc.EditRate != EditRate_16
       && ADesc.EditRate != EditRate_18
       && ADesc.EditRate != EditRate_20
       && ADesc.EditRate != EditRate_22
       && ADesc.EditRate != EditRate_23_98 )
    {
      DefaultLogSink().Error("AudioDescriptor.EditRate is not a supported value: %d/%d\n",
			     ADesc.EditRate.Numerator, ADesc.EditRate.Denominator);
      return RESULT_RAW_FORMAT;
    }

  if ( ADesc.AudioSamplingRate != SampleRate_48k && ADesc.AudioSamplingRate != SampleRate_96k )
    {
      DefaultLogSink().Error("AudioDescriptor.AudioSamplingRate is not 48000/1 or 96000/1: %d/%d\n",
			     ADesc.AudioSamplingRate.Numerator, ADesc.AudioSamplingRate.Denominator);
      return RESULT_RAW_FORMAT;
    }

  assert(m_Dict);
  m_ADesc = ADesc;

  Result_t result = PCM_ADesc_to_MD(m_ADesc, (WaveAudioDescriptor*)m_EssenceDescriptor);
  
  if ( ASDCP_SUCCESS(result) )
    {
      memcpy(m_EssenceUL, m_Dict->ul(MDD_WAVEssence), SMPTE_UL_LENGTH);
      m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
      result = m_State.Goto_READY();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = WriteASDCPHeader(PCM_PACKAGE_LABEL, UL(m_Dict->ul(MDD_WAVWrappingFrame)),
				SOUND_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_SoundDataDef)),
				m_ADesc.EditRate, derive_timecode_rate_from_edit_rate(m_ADesc.EditRate),
				calc_CBR_frame_size(m_Info, m_ADesc));
    }

  return result;
}